

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O2

Vector<std::complex<float>,_4UL> *
Gs::operator*(Vector<std::complex<float>,_4UL> *__return_storage_ptr__,
             Matrix<std::complex<float>,_4UL,_4UL> *lhs,Vector<std::complex<float>,_4UL> *rhs)

{
  long lVar1;
  complex<float> *__x;
  size_t r;
  long lVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Db;
  
  (__return_storage_ptr__->z)._M_value = 0;
  (__return_storage_ptr__->x)._M_value = 0;
  (__return_storage_ptr__->y)._M_value = 0;
  (__return_storage_ptr__->w)._M_value = 0x3f800000;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    (&__return_storage_ptr__->x)[lVar2]._M_value = 0;
    fVar3 = 0.0;
    fVar4 = 0.0;
    lVar1 = 0;
    __x = lhs->m_;
    for (; lVar1 != 0x20; lVar1 = lVar1 + 8) {
      std::operator*(__x,(complex<float> *)((long)&(rhs->x)._M_value + lVar1));
      fVar3 = fVar3 + extraout_XMM0_Da;
      fVar4 = fVar4 + extraout_XMM0_Db;
      *(float *)&(&__return_storage_ptr__->x)[lVar2]._M_value = fVar3;
      *(float *)((long)&(&__return_storage_ptr__->x)[lVar2]._M_value + 4) = fVar4;
      __x = __x + 4;
    }
    lhs = (Matrix<std::complex<float>,_4UL,_4UL> *)((long)lhs + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<T, Rows> operator * (const Matrix<T, Rows, Cols>& lhs, const Vector<T, Cols>& rhs)
{
    Vector<T, Rows> result;

    for (std::size_t r = 0; r < Rows; ++r)
    {
        result[r] = T(0);
        for (std::size_t c = 0; c < Cols; ++c)
            result[r] += lhs(r, c)*rhs[c];
    }

    return result;
}